

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexcmp.cpp
# Opt level: O0

UBool __thiscall icu_63::RegexCompile::compileInlineInterval(RegexCompile *this)

{
  int32_t index;
  int32_t iVar1;
  int64_t iVar2;
  int local_2c;
  int32_t i;
  int32_t saveOp;
  int32_t endOfSequenceLoc;
  int32_t op;
  int32_t topOfBlock;
  RegexCompile *this_local;
  
  if ((this->fIntervalUpper < 0xb) && (this->fIntervalLow <= this->fIntervalUpper)) {
    index = blockTopLoc(this,'\0');
    if (this->fIntervalUpper == 0) {
      UVector64::setSize(this->fRXPat->fCompiledPat,index);
      if (index <= this->fMatchOpenParen) {
        this->fMatchOpenParen = -1;
      }
      if (index <= this->fMatchCloseParen) {
        this->fMatchCloseParen = -1;
      }
      this_local._7_1_ = '\x01';
    }
    else {
      iVar1 = UVector64::size(this->fRXPat->fCompiledPat);
      if ((index == iVar1 + -1) || (this->fIntervalUpper == 1)) {
        iVar2 = UVector64::elementAti(this->fRXPat->fCompiledPat,index);
        iVar1 = UVector64::size(this->fRXPat->fCompiledPat);
        iVar1 = buildOp(this,6,iVar1 + -1 + this->fIntervalUpper +
                               (this->fIntervalUpper - this->fIntervalLow));
        if (this->fIntervalLow == 0) {
          insertOp(this,index);
          UVector64::setElementAt(this->fRXPat->fCompiledPat,(long)iVar1,index);
        }
        for (local_2c = 1; local_2c < this->fIntervalUpper; local_2c = local_2c + 1) {
          if (this->fIntervalLow <= local_2c) {
            appendOp(this,iVar1);
          }
          appendOp(this,(int32_t)iVar2);
        }
        this_local._7_1_ = '\x01';
      }
      else {
        this_local._7_1_ = '\0';
      }
    }
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool RegexCompile::compileInlineInterval() {
    if (fIntervalUpper > 10 || fIntervalUpper < fIntervalLow) {
        // Too big to inline.  Fail, which will cause looping code to be generated.
        //   (Upper < Lower picks up unbounded upper and errors, both.)
        return FALSE;
    }

    int32_t   topOfBlock = blockTopLoc(FALSE);
    if (fIntervalUpper == 0) {
        // Pathological case.  Attempt no matches, as if the block doesn't exist.
        // Discard the generated code for the block.
        // If the block included parens, discard the info pertaining to them as well.
        fRXPat->fCompiledPat->setSize(topOfBlock);
        if (fMatchOpenParen >= topOfBlock) {
            fMatchOpenParen = -1;
        }
        if (fMatchCloseParen >= topOfBlock) {
            fMatchCloseParen = -1;
        }
        return TRUE;
    }

    if (topOfBlock != fRXPat->fCompiledPat->size()-1 && fIntervalUpper != 1) {
        // The thing being repeated is not a single op, but some
        //   more complex block.  Do it as a loop, not inlines.
        //   Note that things "repeated" a max of once are handled as inline, because
        //     the one copy of the code already generated is just fine.
        return FALSE;
    }

    // Pick up the opcode that is to be repeated
    //
    int32_t op = (int32_t)fRXPat->fCompiledPat->elementAti(topOfBlock);

    // Compute the pattern location where the inline sequence
    //   will end, and set up the state save op that will be needed.
    //
    int32_t endOfSequenceLoc = fRXPat->fCompiledPat->size()-1
                                + fIntervalUpper + (fIntervalUpper-fIntervalLow);
    int32_t saveOp = buildOp(URX_STATE_SAVE, endOfSequenceLoc);
    if (fIntervalLow == 0) {
        insertOp(topOfBlock);
        fRXPat->fCompiledPat->setElementAt(saveOp, topOfBlock);
    }



    //  Loop, emitting the op for the thing being repeated each time.
    //    Loop starts at 1 because one instance of the op already exists in the pattern,
    //    it was put there when it was originally encountered.
    int32_t i;
    for (i=1; i<fIntervalUpper; i++ ) {
        if (i >= fIntervalLow) {
            appendOp(saveOp);
        }
        appendOp(op);
    }
    return TRUE;
}